

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int set_file_encryption(int argc,char **argv)

{
  char *pcVar1;
  FILE *__stream;
  zip_uint16_t zVar2;
  int iVar3;
  ulonglong uVar4;
  size_t sVar5;
  undefined8 uVar6;
  char *local_30;
  char *password;
  zip_uint64_t idx;
  zip_uint16_t method;
  char **argv_local;
  int argc_local;
  
  uVar4 = strtoull(*argv,(char **)0x0,10);
  zVar2 = get_encryption_method(argv[1]);
  local_30 = argv[2];
  sVar5 = strlen(local_30);
  if (sVar5 == 0) {
    local_30 = (char *)0x0;
  }
  iVar3 = zip_file_set_encryption(za,uVar4,zVar2,local_30);
  __stream = _stderr;
  if (iVar3 < 0) {
    pcVar1 = argv[1];
    uVar6 = zip_strerror(za);
    fprintf(__stream,"can\'t set file encryption method at index \'%lu\' to \'%s\': %s\n",uVar4,
            pcVar1,uVar6);
    argv_local._4_4_ = -1;
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
set_file_encryption(int argc, char *argv[]) {
    zip_uint16_t method;
    zip_uint64_t idx;
    char *password;
    idx = strtoull(argv[0], NULL, 10);
    method = get_encryption_method(argv[1]);
    password = argv[2];
    if (strlen(password) == 0) {
	password = NULL;
    }
    if (zip_file_set_encryption(za, idx, method, password) < 0) {
	fprintf(stderr, "can't set file encryption method at index '%" PRIu64 "' to '%s': %s\n", idx, argv[1], zip_strerror(za));
	return -1;
    }
    return 0;
}